

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_hadamard_lp_8x8_dual_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  int i;
  int16_t *in_stack_00000058;
  ptrdiff_t in_stack_00000060;
  int16_t *in_stack_00000068;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    hadamard_lp_8x8_sse2(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

void aom_hadamard_lp_8x8_dual_sse2(const int16_t *src_diff,
                                   ptrdiff_t src_stride, int16_t *coeff) {
  for (int i = 0; i < 2; i++) {
    hadamard_lp_8x8_sse2(src_diff + (i * 8), src_stride, coeff + (i * 64));
  }
}